

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

int deqp::gls::BuiltinPrecisionTests::DefaultSampling<int>::getNumBits(Precision prec)

{
  undefined4 local_c;
  Precision prec_local;
  
  if (prec == PRECISION_LOWP) {
    local_c = 8;
  }
  else if (prec == PRECISION_MEDIUMP) {
    local_c = 0x10;
  }
  else if (prec == PRECISION_HIGHP) {
    local_c = 0x20;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

static inline int getNumBits (Precision prec)
	{
		switch (prec)
		{
			case glu::PRECISION_LOWP:		return 8;
			case glu::PRECISION_MEDIUMP:	return 16;
			case glu::PRECISION_HIGHP:		return 32;
			default:
				DE_ASSERT(false);
				return 0;
		}
	}